

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

int __thiscall MeCab::DecoderFeatureIndex::id(DecoderFeatureIndex *this,char *key)

{
  uint64_t *puVar1;
  int iVar2;
  size_t size;
  unsigned_long *puVar3;
  ostream *poVar4;
  die local_19;
  uint64_t fp;
  
  size = strlen(key);
  fp = fingerprint(key,size);
  puVar3 = std::__lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (this->key_,this->key_ + (this->super_FeatureIndex).maxid_);
  puVar1 = this->key_;
  iVar2 = -1;
  if (((puVar3 != puVar1 + (this->super_FeatureIndex).maxid_) && (*puVar3 == fp)) &&
     (iVar2 = (int)((ulong)((long)puVar3 - (long)puVar1) >> 3), puVar1[iVar2] != *puVar3)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1be);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"key_[n] == fp");
    std::operator<<(poVar4,"] ");
    die::~die(&local_19);
  }
  return iVar2;
}

Assistant:

int DecoderFeatureIndex::id(const char *key) {
  const uint64_t fp = fingerprint(key, std::strlen(key));
  const uint64_t *result = std::lower_bound(key_,
                                            key_ + maxid_,
                                            fp);
  if (result == key_ + maxid_ || *result != fp) {
    return -1;
  }
  const int n = static_cast<int>(result - key_);
  CHECK_DIE(key_[n] == fp);
  return n;
}